

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamReader::addExtraNamespaceDeclaration
          (QXmlStreamReader *this,QXmlStreamNamespaceDeclaration *extraNamespaceDeclaration)

{
  _Head_base<0UL,_QXmlStreamReaderPrivate_*,_false> this_00;
  NamespaceDeclaration *pNVar1;
  long in_FS_OFFSET;
  QAnyStringView s;
  QAnyStringView s_00;
  XmlStringRef local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
       .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
  pNVar1 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
                     ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                      this_00._M_head_impl);
  s.m_size = (extraNamespaceDeclaration->m_prefix).m_string.size | 0x8000000000000000;
  s.field_0.m_data_utf16 = (extraNamespaceDeclaration->m_prefix).m_string.ptr;
  QXmlStreamPrivateTagStack::addToStringStorage
            (&local_48,&(this_00._M_head_impl)->super_QXmlStreamPrivateTagStack,s);
  (pNVar1->prefix).m_size = local_48.m_size;
  (pNVar1->prefix).m_string = (QString *)CONCAT44(local_48.m_string._4_4_,local_48.m_string._0_4_);
  (pNVar1->prefix).m_pos = CONCAT44(local_48.m_pos._4_4_,(undefined4)local_48.m_pos);
  s_00.m_size = (extraNamespaceDeclaration->m_namespaceUri).m_string.size | 0x8000000000000000;
  s_00.field_0.m_data_utf16 = (extraNamespaceDeclaration->m_namespaceUri).m_string.ptr;
  QXmlStreamPrivateTagStack::addToStringStorage
            (&local_48,&(this_00._M_head_impl)->super_QXmlStreamPrivateTagStack,s_00);
  (pNVar1->namespaceUri).m_size = local_48.m_size;
  *(undefined4 *)&(pNVar1->namespaceUri).m_string = local_48.m_string._0_4_;
  *(undefined4 *)((long)&(pNVar1->namespaceUri).m_string + 4) = local_48.m_string._4_4_;
  *(undefined4 *)&(pNVar1->namespaceUri).m_pos = (undefined4)local_48.m_pos;
  *(undefined4 *)((long)&(pNVar1->namespaceUri).m_pos + 4) = local_48.m_pos._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReader::addExtraNamespaceDeclaration(const QXmlStreamNamespaceDeclaration &extraNamespaceDeclaration)
{
    Q_D(QXmlStreamReader);
    QXmlStreamReaderPrivate::NamespaceDeclaration &namespaceDeclaration = d->namespaceDeclarations.push();
    namespaceDeclaration.prefix = d->addToStringStorage(extraNamespaceDeclaration.prefix());
    namespaceDeclaration.namespaceUri = d->addToStringStorage(extraNamespaceDeclaration.namespaceUri());
}